

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O3

PixelFormat
deqp::egl::anon_unknown_4::getPixelFormat(Library *egl,EGLDisplay display,EGLConfig config)

{
  EGLint EVar1;
  EGLint EVar2;
  EGLint EVar3;
  PixelFormat PVar4;
  
  PVar4.redBits = eglu::getConfigAttribInt(egl,display,config,0x3024);
  EVar1 = eglu::getConfigAttribInt(egl,display,config,0x3023);
  EVar2 = eglu::getConfigAttribInt(egl,display,config,0x3022);
  EVar3 = eglu::getConfigAttribInt(egl,display,config,0x3021);
  PVar4.alphaBits = EVar3;
  PVar4.blueBits = EVar2;
  PVar4.greenBits = EVar1;
  return PVar4;
}

Assistant:

tcu::PixelFormat getPixelFormat (const Library& egl, EGLDisplay display, EGLConfig config)
{
	tcu::PixelFormat fmt;
	fmt.redBits		= eglu::getConfigAttribInt(egl, display, config, EGL_RED_SIZE);
	fmt.greenBits	= eglu::getConfigAttribInt(egl, display, config, EGL_GREEN_SIZE);
	fmt.blueBits	= eglu::getConfigAttribInt(egl, display, config, EGL_BLUE_SIZE);
	fmt.alphaBits	= eglu::getConfigAttribInt(egl, display, config, EGL_ALPHA_SIZE);
	return fmt;
}